

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

int cmsys::SystemTools::EstimateFormatLength(char *format,__va_list_tag *ap)

{
  byte bVar1;
  uint uVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  undefined8 *puVar6;
  size_t sVar7;
  char *pcVar8;
  
  if (format == (char *)0x0) {
    iVar4 = 0;
  }
  else {
    sVar5 = strlen(format);
    cVar3 = *format;
    while (iVar4 = (int)sVar5, cVar3 != '\0') {
      pcVar8 = format + 1;
      if (cVar3 == '%') {
        if (*pcVar8 != '%') {
          do {
            bVar1 = format[1];
            format = format + 1;
            iVar4 = isalpha((int)(char)bVar1);
          } while (iVar4 == 0);
          pcVar8 = format;
          if (bVar1 - 0x65 < 3) {
            if (ap->fp_offset < 0xa1) {
              ap->fp_offset = ap->fp_offset + 0x10;
              sVar5 = sVar5 + 0x40;
            }
            else {
LAB_0038c9fb:
              ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
              sVar5 = sVar5 + 0x40;
            }
          }
          else if (bVar1 == 0x73) {
            uVar2 = ap->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              puVar6 = (undefined8 *)((ulong)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              puVar6 = (undefined8 *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar6 + 1;
            }
            if ((char *)*puVar6 != (char *)0x0) {
              sVar7 = strlen((char *)*puVar6);
              sVar5 = sVar5 + sVar7;
            }
          }
          else {
            if (0x28 < ap->gp_offset) goto LAB_0038c9fb;
            ap->gp_offset = ap->gp_offset + 8;
            sVar5 = sVar5 + 0x40;
          }
        }
        pcVar8 = pcVar8 + 1;
      }
      format = pcVar8;
      cVar3 = *pcVar8;
    }
  }
  return iVar4;
}

Assistant:

int SystemTools::EstimateFormatLength(const char* format, va_list ap)
{
  if (!format) {
    return 0;
  }

  // Quick-hack attempt at estimating the length of the string.
  // Should never under-estimate.

  // Start with the length of the format string itself.

  size_t length = strlen(format);

  // Increase the length for every argument in the format.

  const char* cur = format;
  while (*cur) {
    if (*cur++ == '%') {
      // Skip "%%" since it doesn't correspond to a va_arg.
      if (*cur != '%') {
        while (!int(isalpha(*cur))) {
          ++cur;
        }
        switch (*cur) {
          case 's': {
            // Check the length of the string.
            char* s = va_arg(ap, char*);
            if (s) {
              length += strlen(s);
            }
          } break;
          case 'e':
          case 'f':
          case 'g': {
            // Assume the argument contributes no more than 64 characters.
            length += 64;

            // Eat the argument.
            static_cast<void>(va_arg(ap, double));
          } break;
          default: {
            // Assume the argument contributes no more than 64 characters.
            length += 64;

            // Eat the argument.
            static_cast<void>(va_arg(ap, int));
          } break;
        }
      }

      // Move past the characters just tested.
      ++cur;
    }
  }

  return static_cast<int>(length);
}